

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_test.cpp
# Opt level: O0

void __thiscall
vm_test_interpret_prog_Test::vm_test_interpret_prog_Test(vm_test_interpret_prog_Test *this)

{
  vm_test_interpret_prog_Test *this_local;
  
  anon_unknown.dwarf_19705::vm_test::vm_test(&this->super_vm_test);
  (this->super_vm_test).super_Test._vptr_Test =
       (_func_int **)&PTR__vm_test_interpret_prog_Test_002000d0;
  return;
}

Assistant:

TEST_F(vm_test, interpret_prog) {
  // push 1
  // dup
  // zero
  // randn 2
  // rotln 3
  // jump 0x17 (last instruction)
  EXPECT_EQ(
      vm1.interpret(prog_chunk({0x3, 0x1, 0x0,  0x0, 0x0, 0x2, 0x0,  0x4,
                                0x2, 0x0, 0x0,  0x0, 0x5, 0x3, 0x0,  0x0,
                                0x0, 0x1, 0x17, 0x0, 0x0, 0x0, 0x90, 0x0})),
      status_type::SUCCESS);

  // 3 not in the stack as it is a direct pipe instruction
  std::vector<unsigned> exp_stack = {2, 0, 4, 5, 1, 0};
  EXPECT_EQ(iset1.call_stack, exp_stack);
}